

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool prvTidyAdjustCharEncoding(TidyDocImpl *doc,int encoding)

{
  int local_24;
  int local_20;
  int inenc;
  int outenc;
  int encoding_local;
  TidyDocImpl *doc_local;
  
  local_20 = -1;
  local_24 = -1;
  switch(encoding) {
  case 0:
  case 3:
  case 4:
  case 5:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    local_24 = encoding;
    local_20 = encoding;
    break;
  case 1:
    local_24 = 3;
    local_20 = 1;
    break;
  case 2:
    local_24 = 2;
    local_20 = 1;
    break;
  case 6:
    local_24 = 6;
    local_20 = 1;
    break;
  case 7:
    local_24 = 7;
    local_20 = 1;
    break;
  case 8:
    local_24 = 8;
    local_20 = 1;
  }
  if (-1 < local_24) {
    prvTidySetOptionInt(doc,TidyCharEncoding,(long)encoding);
    prvTidySetOptionInt(doc,TidyInCharEncoding,(long)local_24);
    prvTidySetOptionInt(doc,TidyOutCharEncoding,(long)local_20);
  }
  doc_local._4_4_ = (Bool)(-1 < local_24);
  return doc_local._4_4_;
}

Assistant:

Bool  TY_(AdjustCharEncoding)( TidyDocImpl* doc, int encoding )
{
    int outenc = -1;
    int inenc = -1;
    
    switch( encoding )
    {
    case MACROMAN:
        inenc = MACROMAN;
        outenc = ASCII;
        break;

    case WIN1252:
        inenc = WIN1252;
        outenc = ASCII;
        break;

    case IBM858:
        inenc = IBM858;
        outenc = ASCII;
        break;

    case ASCII:
        inenc = LATIN1;
        outenc = ASCII;
        break;

    case LATIN0:
        inenc = LATIN0;
        outenc = ASCII;
        break;

    case RAW:
    case LATIN1:
    case UTF8:
#ifndef NO_NATIVE_ISO2022_SUPPORT
    case ISO2022:
#endif

    case UTF16LE:
    case UTF16BE:
    case UTF16:
    case SHIFTJIS:
    case BIG5:
        inenc = outenc = encoding;
        break;
    }

    if ( inenc >= 0 )
    {
        TY_(SetOptionInt)( doc, TidyCharEncoding, encoding );
        TY_(SetOptionInt)( doc, TidyInCharEncoding, inenc );
        TY_(SetOptionInt)( doc, TidyOutCharEncoding, outenc );
        return yes;
    }
    return no;
}